

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatInt
          (LocalizedNumberFormatter *this,int64_t value,UErrorCode *status)

{
  UFormattedNumberData *this_00;
  UErrorCode *in_RCX;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *extraout_RDX_01;
  UErrorCode UVar1;
  UFormattedNumberData *p;
  FormattedNumber FVar2;
  
  if (*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,value);
    if (this_00 == (UFormattedNumberData *)0x0) {
      *in_RCX = U_MEMORY_ALLOCATION_ERROR;
      UVar1 = U_MEMORY_ALLOCATION_ERROR;
      status = extraout_RDX;
    }
    else {
      UVar1 = U_ZERO_ERROR;
      memset(this_00,0,0x158);
      impl::UFormattedNumberData::UFormattedNumberData(this_00);
      impl::DecimalQuantity::setToLong(&this_00->quantity,(int64_t)status);
      p = this_00;
      formatImpl((LocalizedNumberFormatter *)value,this_00,in_RCX);
      status = extraout_RDX_00;
      if (*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0029697b;
      impl::UFormattedNumberData::~UFormattedNumberData(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
      UVar1 = *in_RCX;
      status = extraout_RDX_01;
    }
  }
  else {
    UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  this_00 = (UFormattedNumberData *)0x0;
LAB_0029697b:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       this_00;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.errorCode = UVar1;
  FVar2._8_8_ = status;
  FVar2.fResults = (UFormattedNumberData *)this;
  return FVar2;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatInt(int64_t value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToLong(value);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}